

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

string * __thiscall
uint256_tests::ArrayToString_abi_cxx11_
          (string *__return_storage_ptr__,uint256_tests *this,uchar *A,uint width)

{
  ostream *poVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  stringstream Stream;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream((stringstream *)&Stream);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  for (uVar2 = (ulong)A & 0xffffffff; uVar2 != 0; uVar2 = uVar2 - 1) {
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
    poVar1 = std::operator<<(local_1a8,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&Stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string ArrayToString(const unsigned char A[], unsigned int width)
{
    std::stringstream Stream;
    Stream << std::hex;
    for (unsigned int i = 0; i < width; ++i)
    {
        Stream<<std::setw(2)<<std::setfill('0')<<(unsigned int)A[width-i-1];
    }
    return Stream.str();
}